

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_make_eval_context(sexp ctx,sexp stack,sexp env,sexp_uint_t size,sexp_uint_t max_size)

{
  sexp psVar1;
  sexp_gc_var_t *extraout_RDX;
  sexp_gc_var_t *n;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  local_30 = (sexp)0x43e;
  local_28.var = (sexp *)0x0;
  local_28.next = (sexp_gc_var_t *)0x0;
  local_30 = sexp_make_context(ctx,size,max_size);
  psVar1 = local_30;
  if ((local_30 != (sexp)0x0) && ((((ulong)local_30 & 3) != 0 || (local_30->tag != 0x13)))) {
    n = extraout_RDX;
    if (ctx != (sexp)0x0) {
      local_28.var = &local_30;
      n = &local_28;
      local_28.next = (ctx->value).context.saves;
      (ctx->value).context.saves = n;
    }
    if (env == (sexp)0x0) {
      env = sexp_make_primitive_env_op(local_30,(sexp)size,(sexp_sint_t)n,(sexp)&DAT_0000000f);
    }
    (local_30->value).type.cpl = env;
    psVar1 = sexp_make_vector_op(local_30,(sexp)0x0,2,(sexp)&DAT_0000000f,(sexp)&DAT_00000001);
    (local_30->value).opcode.methods = psVar1;
    (psVar1->value).bytecode.length = 0x3e;
    (((local_30->value).opcode.methods)->value).uvector.length = 0x23e;
    psVar1 = sexp_alloc_tagged_aux(local_30,0xb0,0x18);
    (((local_30->value).opcode.methods)->value).type.cpl = psVar1;
    psVar1 = (local_30->value).type.cpl;
    if ((((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) &&
        ((psVar1 = (local_30->value).opcode.methods, ((ulong)psVar1 & 3) != 0 ||
         (psVar1->tag != 0x13)))) &&
       ((psVar1 = (psVar1->value).type.cpl, ((ulong)psVar1 & 3) != 0 || (psVar1->tag != 0x13)))) {
      (psVar1->value).flonum = 3.06320700421573e-322;
      (((((local_30->value).opcode.methods)->value).type.cpl)->value).bytecode.length = 0x80;
      (((((local_30->value).opcode.methods)->value).type.cpl)->value).string.offset = 0x23e;
      (((((local_30->value).opcode.methods)->value).type.cpl)->value).uvector.length = 0x23e;
      if ((stack == (sexp)&DAT_0000003e) || (stack == (sexp)0x0)) {
        stack = sexp_alloc_tagged_aux(local_30,0x2018,0x23);
        if ((((ulong)stack & 3) == 0) && (stack->tag == 0x13)) {
          if (ctx == (sexp)0x0) {
            return stack;
          }
          (ctx->value).context.saves = local_28.next;
          return stack;
        }
        (stack->value).flonum = 5.05923221341436e-321;
        (stack->value).type.cpl = (sexp)0x0;
      }
      (local_30->value).type.name = stack;
      if (ctx == (sexp)0x0) {
        sexp_init_eval_context_globals(local_30);
        psVar1 = sexp_make_vector_op(local_30,(sexp)0x0,2,(sexp)&DAT_00000009,(sexp)&DAT_0000003e);
        (local_30->value).type.id = psVar1;
        (psVar1->value).string.offset = 1;
        psVar1 = local_30;
      }
      else {
        (local_30->value).type.print = (ctx->value).type.print;
        (local_30->value).flonum_bits[0x60a1] = (ctx->value).flonum_bits[0x60a1];
        (local_30->value).type.id = (ctx->value).type.id;
        (ctx->value).context.saves = local_28.next;
        psVar1 = local_30;
      }
    }
  }
  return psVar1;
}

Assistant:

sexp sexp_make_eval_context (sexp ctx, sexp stack, sexp env, sexp_uint_t size, sexp_uint_t max_size) {
  sexp_gc_var1(res);
  res = sexp_make_context(ctx, size, max_size);
  if (!res || sexp_exceptionp(res))
    return res;
  if (ctx) sexp_gc_preserve1(ctx, res);
  sexp_context_env(res) = (env ? env : sexp_make_primitive_env(res, SEXP_SEVEN));
  sexp_context_specific(res) = sexp_make_vector(res, SEXP_SEVEN, SEXP_ZERO);
  sexp_context_lambda(res) = SEXP_FALSE;
  sexp_context_fv(res) = SEXP_NULL;
  sexp_context_bc(res) = sexp_alloc_bytecode(res, SEXP_INIT_BCODE_SIZE);
  if (sexp_exceptionp(sexp_context_env(res))) {
    res = sexp_context_env(res);
  } else if (sexp_exceptionp(sexp_context_specific(res))) {
    res = sexp_context_specific(res);
  } else if (sexp_exceptionp(sexp_context_bc(res))) {
    res = sexp_context_bc(res);
  } else {
    sexp_bytecode_name(sexp_context_bc(res)) = SEXP_FALSE;
    sexp_bytecode_length(sexp_context_bc(res)) = SEXP_INIT_BCODE_SIZE;
    sexp_bytecode_literals(sexp_context_bc(res)) = SEXP_NULL;
    sexp_bytecode_source(sexp_context_bc(res)) = SEXP_NULL;
    if ((! stack) || (stack == SEXP_FALSE)) {
      stack = sexp_alloc_tagged(res, SEXP_STACK_SIZE, SEXP_STACK);
      if (sexp_exceptionp(stack)) {
        if (ctx) sexp_gc_release1(ctx);
        return stack;
      } else {
        sexp_stack_length(stack) = SEXP_INIT_STACK_SIZE;
        sexp_stack_top(stack) = 0;
      }
    }
    sexp_context_stack(res) = stack;
    if (! ctx) sexp_init_eval_context_globals(res);
    if (ctx) {
      sexp_context_params(res) = sexp_context_params(ctx);
      sexp_context_tracep(res) = sexp_context_tracep(ctx);
      sexp_context_dk(res) = sexp_context_dk(ctx);
      sexp_gc_release1(ctx);
    } else {
      /* TODO: make the root a global (with friendly error in/out) */
      sexp_context_dk(res) = sexp_make_vector(res, SEXP_FOUR, SEXP_FALSE);
      sexp_vector_set(sexp_context_dk(res), SEXP_ZERO, SEXP_ZERO);
    }
  }
  return res;
}